

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

_Bool cfg_is_allowed_key(char *key)

{
  size_t sVar1;
  
  if ((byte)(*key - 0x30U) < 10) {
    return false;
  }
  sVar1 = strspn(key,"_0123456789abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ");
  return key[sVar1] == '\0';
}

Assistant:

bool
cfg_is_allowed_key(const char *key) {
  static const char *valid = "_0123456789"
                             "abcdefghijklmnopqrstuvwxyz"
                             "ABCDEFGHIJKLMNOPQRSTUVWXYZ";
  /* test for [a-zA-Z_][a-zA-Z0-9_]* */
  if (*key >= '0' && *key <= '9') {
    return false;
  }

  return key[strspn(key, valid)] == 0;
}